

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O3

void __thiscall
btMultiBodyDynamicsWorld::btMultiBodyDynamicsWorld
          (btMultiBodyDynamicsWorld *this,btDispatcher *dispatcher,btBroadphaseInterface *pairCache,
          btMultiBodyConstraintSolver *constraintSolver,
          btCollisionConfiguration *collisionConfiguration)

{
  int *piVar1;
  MultiBodyInplaceSolverIslandCallback *pMVar2;
  
  btDiscreteDynamicsWorld::btDiscreteDynamicsWorld
            (&this->super_btDiscreteDynamicsWorld,dispatcher,pairCache,
             (btConstraintSolver *)constraintSolver,collisionConfiguration);
  (this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
  _vptr_btCollisionWorld = (_func_int **)&PTR__btMultiBodyDynamicsWorld_00220ea8;
  (this->m_multiBodies).m_ownsMemory = true;
  (this->m_multiBodies).m_data = (btMultiBody **)0x0;
  (this->m_multiBodies).m_size = 0;
  (this->m_multiBodies).m_capacity = 0;
  (this->m_multiBodyConstraints).m_ownsMemory = true;
  (this->m_multiBodyConstraints).m_data = (btMultiBodyConstraint **)0x0;
  (this->m_multiBodyConstraints).m_size = 0;
  (this->m_multiBodyConstraints).m_capacity = 0;
  (this->m_sortedMultiBodyConstraints).m_ownsMemory = true;
  (this->m_sortedMultiBodyConstraints).m_data = (btMultiBodyConstraint **)0x0;
  (this->m_sortedMultiBodyConstraints).m_size = 0;
  (this->m_sortedMultiBodyConstraints).m_capacity = 0;
  this->m_multiBodyConstraintSolver = constraintSolver;
  (this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.m_solverInfo.
  super_btContactSolverInfoData.m_splitImpulse = 0;
  piVar1 = &(this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.m_solverInfo.
            super_btContactSolverInfoData.m_solverMode;
  *(byte *)piVar1 = (byte)*piVar1 | 0x10;
  pMVar2 = (MultiBodyInplaceSolverIslandCallback *)operator_new(200);
  (pMVar2->super_IslandCallback)._vptr_IslandCallback =
       (_func_int **)&PTR__MultiBodyInplaceSolverIslandCallback_002210a0;
  pMVar2->m_solverInfo = (btContactSolverInfo *)0x0;
  pMVar2->m_solver = constraintSolver;
  pMVar2->m_multiBodySortedConstraints = (btMultiBodyConstraint **)0x0;
  pMVar2->m_numConstraints = 0;
  pMVar2->m_debugDrawer = (btIDebugDraw *)0x0;
  pMVar2->m_dispatcher = dispatcher;
  (pMVar2->m_bodies).m_ownsMemory = true;
  (pMVar2->m_bodies).m_data = (btCollisionObject **)0x0;
  (pMVar2->m_bodies).m_size = 0;
  (pMVar2->m_bodies).m_capacity = 0;
  (pMVar2->m_manifolds).m_ownsMemory = true;
  (pMVar2->m_manifolds).m_data = (btPersistentManifold **)0x0;
  (pMVar2->m_manifolds).m_size = 0;
  (pMVar2->m_manifolds).m_capacity = 0;
  (pMVar2->m_constraints).m_ownsMemory = true;
  (pMVar2->m_constraints).m_data = (btTypedConstraint **)0x0;
  (pMVar2->m_constraints).m_size = 0;
  (pMVar2->m_constraints).m_capacity = 0;
  (pMVar2->m_multiBodyConstraints).m_ownsMemory = true;
  (pMVar2->m_multiBodyConstraints).m_data = (btMultiBodyConstraint **)0x0;
  (pMVar2->m_multiBodyConstraints).m_size = 0;
  (pMVar2->m_multiBodyConstraints).m_capacity = 0;
  this->m_solverMultiBodyIslandCallback = pMVar2;
  return;
}

Assistant:

btMultiBodyDynamicsWorld::btMultiBodyDynamicsWorld(btDispatcher* dispatcher,btBroadphaseInterface* pairCache,btMultiBodyConstraintSolver* constraintSolver,btCollisionConfiguration* collisionConfiguration)
	:btDiscreteDynamicsWorld(dispatcher,pairCache,constraintSolver,collisionConfiguration),
	m_multiBodyConstraintSolver(constraintSolver)
{
	//split impulse is not yet supported for Featherstone hierarchies
	getSolverInfo().m_splitImpulse = false;
	getSolverInfo().m_solverMode |=SOLVER_USE_2_FRICTION_DIRECTIONS;
	m_solverMultiBodyIslandCallback = new MultiBodyInplaceSolverIslandCallback(constraintSolver,dispatcher);
}